

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

ScopedStmtBlock * __thiscall
kratos::SwitchStmt::add_switch_case
          (SwitchStmt *this,shared_ptr<kratos::Const> *switch_case,shared_ptr<kratos::Stmt> *stmt)

{
  bool bVar1;
  StatementType SVar2;
  element_type *peVar3;
  element_type *peVar4;
  int64_t iVar5;
  int64_t iVar6;
  element_type *peVar7;
  element_type *this_00;
  reference stmt_00;
  StmtBlock *pSVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_bool>
  pVar9;
  shared_ptr<kratos::Stmt> *s_1;
  iterator __end2;
  iterator __begin2;
  element_type *__range2;
  shared_ptr<kratos::StmtBlock> blk;
  shared_ptr<kratos::ScopedStmtBlock> local_80 [2];
  undefined8 local_60;
  type *s;
  type *c;
  _Self local_48;
  iterator __end1;
  iterator __begin1;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *__range1;
  shared_ptr<kratos::ScopedStmtBlock> switch_stmt;
  shared_ptr<kratos::Stmt> *stmt_local;
  shared_ptr<kratos::Const> *switch_case_local;
  SwitchStmt *this_local;
  
  switch_stmt.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stmt;
  peVar3 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )stmt);
  (*(peVar3->super_IRNode)._vptr_IRNode[7])(peVar3,this);
  std::shared_ptr<kratos::ScopedStmtBlock>::shared_ptr
            ((shared_ptr<kratos::ScopedStmtBlock> *)&__range1);
  __end1 = std::
           map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
           ::begin(&this->body_);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
       ::end(&this->body_);
  do {
    bVar1 = std::operator!=(&__end1,&local_48);
    if (!bVar1) {
LAB_0025d00d:
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&__range1);
      if (!bVar1) {
        std::make_shared<kratos::ScopedStmtBlock>();
        std::shared_ptr<kratos::ScopedStmtBlock>::operator=
                  ((shared_ptr<kratos::ScopedStmtBlock> *)&__range1,local_80);
        std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr(local_80);
        peVar7 = std::
                 __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&__range1);
        (*(peVar7->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar7,this);
        pVar9 = std::
                map<std::shared_ptr<kratos::Const>,std::shared_ptr<kratos::ScopedStmtBlock>,std::less<std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>>
                ::
                emplace<std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::ScopedStmtBlock>&>
                          ((map<std::shared_ptr<kratos::Const>,std::shared_ptr<kratos::ScopedStmtBlock>,std::less<std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>>
                            *)&this->body_,switch_case,
                           (shared_ptr<kratos::ScopedStmtBlock> *)&__range1);
        blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar9.first._M_node;
      }
      peVar3 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)switch_stmt.
                             super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
      SVar2 = Stmt::type(peVar3);
      if (SVar2 == Block) {
        std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   switch_stmt.
                   super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        Stmt::as<kratos::StmtBlock>((Stmt *)&__range2);
        this_00 = std::
                  __shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator*((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&__range2);
        __end2 = StmtBlock::begin(this_00);
        s_1 = (shared_ptr<kratos::Stmt> *)StmtBlock::end(this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                           *)&s_1), bVar1) {
          stmt_00 = __gnu_cxx::
                    __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                    ::operator*(&__end2);
          pSVar8 = &std::
                    __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&__range1)->super_StmtBlock;
          StmtBlock::add_stmt(pSVar8,stmt_00);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
          ::operator++(&__end2);
        }
        std::shared_ptr<kratos::StmtBlock>::~shared_ptr((shared_ptr<kratos::StmtBlock> *)&__range2);
      }
      else {
        pSVar8 = &std::
                  __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&__range1)->super_StmtBlock;
        StmtBlock::add_stmt(pSVar8,(shared_ptr<kratos::Stmt> *)
                                   switch_stmt.
                                   super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
      }
      peVar7 = std::
               __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&__range1);
      std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
                ((shared_ptr<kratos::ScopedStmtBlock> *)&__range1);
      return peVar7;
    }
    c = &std::
         _Rb_tree_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
         ::operator*(&__end1)->first;
    s = (type *)std::
                get<0ul,std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>
                          ((pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>
                            *)c);
    local_60 = std::
               get<1ul,std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>
                         ((pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>
                           *)c);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)switch_case);
    if ((!bVar1) && (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)s), !bVar1)) {
LAB_0025cfdd:
      std::shared_ptr<kratos::ScopedStmtBlock>::operator=
                ((shared_ptr<kratos::ScopedStmtBlock> *)&__range1,
                 (shared_ptr<kratos::ScopedStmtBlock> *)local_60);
      goto LAB_0025d00d;
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)switch_case);
    if ((bVar1) && (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)s), bVar1)) {
      peVar4 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)s);
      iVar5 = Const::value(peVar4);
      peVar4 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)switch_case);
      iVar6 = Const::value(peVar4);
      if (iVar5 == iVar6) goto LAB_0025cfdd;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

ScopedStmtBlock &SwitchStmt::add_switch_case(const std::shared_ptr<Const> &switch_case,
                                             const std::shared_ptr<Stmt> &stmt) {
    stmt->set_parent(this);
    std::shared_ptr<ScopedStmtBlock> switch_stmt;
    for (auto const &[c, s] : body_) {
        if ((!switch_case && !c) || (switch_case && c && c->value() == switch_case->value())) {
            switch_stmt = s;
            break;
        }
    }
    if (!switch_stmt) {
        switch_stmt = std::make_shared<ScopedStmtBlock>();
        switch_stmt->set_parent(this);
        body_.emplace(switch_case, switch_stmt);
    }
    if (stmt->type() == StatementType::Block) {
        // merge the block
        auto blk = stmt->as<StmtBlock>();
        for (auto const &s : *blk) {
            switch_stmt->add_stmt(s);
        }
    } else {
        switch_stmt->add_stmt(stmt);
    }
    return *switch_stmt;
}